

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O0

void __thiscall FConsoleBuffer::FConsoleBuffer(FConsoleBuffer *this)

{
  uint local_20 [4];
  FConsoleBuffer *local_10;
  FConsoleBuffer *this_local;
  
  local_10 = this;
  TArray<FString,_FString>::TArray(&this->mConsoleText);
  TArray<FBrokenLines_*,_FBrokenLines_*>::TArray(&this->mBrokenConsoleText);
  TArray<unsigned_int,_unsigned_int>::TArray(&this->mBrokenStart);
  TArray<FBrokenLines_*,_FBrokenLines_*>::TArray(&this->mBrokenLines);
  this->mLogFile = (FILE *)0x0;
  this->mAddType = NEWLINE;
  this->mLastFont = (FFont *)0x0;
  this->mLastDisplayWidth = -1;
  this->mLastLineNeedsUpdate = false;
  this->mTextLines = 0;
  this->mBufferWasCleared = true;
  local_20[0] = 0;
  TArray<unsigned_int,_unsigned_int>::Push(&this->mBrokenStart,local_20);
  return;
}

Assistant:

FConsoleBuffer::FConsoleBuffer()
{
	mLogFile = NULL;
	mAddType = NEWLINE;
	mLastFont = NULL;
	mLastDisplayWidth = -1;
	mLastLineNeedsUpdate = false;
	mTextLines = 0;
	mBufferWasCleared = true;
	mBrokenStart.Push(0);
}